

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase47::TestCase47(TestCase47 *this)

{
  TestCase47 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x2f,"legacy test: DynamicApi/Build");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_00cbfb78;
  return;
}

Assistant:

TEST(DynamicApi, Build) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  initDynamicTestMessage(root);
  checkTestMessage(root.asReader().as<TestAllTypes>());

  checkDynamicTestMessage(root.asReader());
  checkDynamicTestMessage(root);
}